

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadHandler.cxx
# Opt level: O1

int __thiscall cmCTestUploadHandler::ProcessHandler(cmCTestUploadHandler *this)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  long *plVar3;
  cmCTest *pcVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  ulong *puVar10;
  size_type *psVar11;
  int iVar12;
  undefined8 uVar13;
  cmXMLWriter xml;
  ostringstream cmCTestLog_msg;
  string buildname;
  cmGeneratedFileStream ofs;
  string local_4e8;
  undefined1 local_4c8 [88];
  string local_470;
  undefined1 local_450 [112];
  ios_base local_3e0 [264];
  string local_2d8;
  string local_2b8;
  cmGeneratedFileStream local_298;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_298,None);
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  cmCTest::GetCurrentTag_abi_cxx11_((string *)local_450,pcVar4);
  pcVar2 = local_4c8 + 0x10;
  local_4c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"Upload.xml","");
  bVar5 = cmCTest::OpenOutputFile(pcVar4,(string *)local_450,(string *)local_4c8,&local_298,false);
  if ((char *)local_4c8._0_8_ != pcVar2) {
    operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
  }
  if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_450,"Cannot open Upload.xml file",0x1b);
    std::ios::widen((char)(ostream *)local_450 + (char)*(long *)(local_450._0_8_ + -0x18));
    std::ostream::put((char)local_450);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                 ,0x23,(char *)local_4c8._0_8_,false);
    if ((char *)local_4c8._0_8_ != pcVar2) {
      operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
    std::ios_base::~ios_base(local_3e0);
    iVar12 = -1;
    goto LAB_001fd8b5;
  }
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  local_4c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"BuildName","");
  cmCTest::GetCTestConfiguration((string *)local_450,pcVar4,(string *)local_4c8);
  cmCTest::SafeBuildIdField(&local_2b8,(string *)local_450);
  if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((char *)local_4c8._0_8_ != pcVar2) {
    operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
  }
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_4c8,(ostream *)&local_298,0);
  plVar3 = (long *)(local_450 + 0x10);
  cmXMLWriter::StartDocument((cmXMLWriter *)local_4c8,"UTF-8");
  cmXMLWriter::ProcessingInstruction
            ((cmXMLWriter *)local_4c8,"xml-stylesheet",
             "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
            );
  local_450._0_8_ = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Site","");
  cmXMLWriter::StartElement((cmXMLWriter *)local_4c8,(string *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_4c8,"BuildName",&local_2b8);
  cmCTest::GetCurrentTag_abi_cxx11_(&local_2d8,(this->super_cmCTestGenericHandler).CTest);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_4e8.field_2._M_allocated_capacity = *puVar10;
    local_4e8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_4e8.field_2._M_allocated_capacity = *puVar10;
    local_4e8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_4e8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cmCTest::GetTestModelString_abi_cxx11_(&local_470,(this->super_cmCTestGenericHandler).CTest);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    uVar13 = local_4e8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_470._M_string_length + local_4e8._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      uVar13 = local_470.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_470._M_string_length + local_4e8._M_string_length) goto LAB_001fd39e;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_470,0,(char *)0x0,(ulong)local_4e8._M_dataplus._M_p);
  }
  else {
LAB_001fd39e:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_470._M_dataplus._M_p);
  }
  psVar11 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar11) {
    local_450._16_8_ = *psVar11;
    local_450._24_8_ = puVar7[3];
    local_450._0_8_ = plVar3;
  }
  else {
    local_450._16_8_ = *psVar11;
    local_450._0_8_ = (size_type *)*puVar7;
  }
  local_450._8_8_ = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)local_4c8,"BuildStamp",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"Site","");
  cmCTest::GetCTestConfiguration((string *)local_450,pcVar4,&local_4e8);
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)local_4c8,"Name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"ctest-","");
  cmVersion::GetCMakeVersion();
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e8);
  psVar11 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar11) {
    local_450._16_8_ = *psVar11;
    local_450._24_8_ = puVar7[3];
    local_450._0_8_ = plVar3;
  }
  else {
    local_450._16_8_ = *psVar11;
    local_450._0_8_ = (size_type *)*puVar7;
  }
  local_450._8_8_ = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  cmXMLWriter::Attribute<std::__cxx11::string>
            ((cmXMLWriter *)local_4c8,"Generator",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  cmCTest::AddSiteProperties((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_4c8);
  local_450._0_8_ = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Upload","");
  cmXMLWriter::StartElement((cmXMLWriter *)local_4c8,(string *)local_450);
  if ((long *)local_450._0_8_ != plVar3) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  p_Var9 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\tUpload file: ",0xe)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_450,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                   ,0x3c,local_4e8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
      std::ios_base::~ios_base(local_3e0);
      local_450._0_8_ = local_450 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"File","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_4c8,(string *)local_450);
      if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                ((cmXMLWriter *)local_4c8,"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1));
      local_450._0_8_ = local_450 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"Content","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_4c8,(string *)local_450);
      if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_4c8,"encoding",(char (*) [7])"base64");
      cmCTest::Base64EncodeFile
                ((string *)local_450,(this->super_cmCTestGenericHandler).CTest,
                 (string *)(p_Var9 + 1));
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_4c8,(string *)local_450);
      if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)local_4c8);
      cmXMLWriter::EndElement((cmXMLWriter *)local_4c8);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)local_4c8);
  cmXMLWriter::EndElement((cmXMLWriter *)local_4c8);
  cmXMLWriter::EndDocument((cmXMLWriter *)local_4c8);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  iVar12 = 0;
LAB_001fd8b5:
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_298);
  return iVar12;
}

Assistant:

int cmCTestUploadHandler::ProcessHandler()
{
  cmGeneratedFileStream ofs;
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), "Upload.xml",
                                   ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open Upload.xml file" << std::endl);
    return -1;
  }
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp",
                this->CTest->GetCurrentTag() + "-" +
                  this->CTest->GetTestModelString());
  xml.Attribute("Name", this->CTest->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  this->CTest->AddSiteProperties(xml);
  xml.StartElement("Upload");

  for (std::string const& file : this->Files) {
    cmCTestOptionalLog(this->CTest, OUTPUT,
                       "\tUpload file: " << file << std::endl, this->Quiet);
    xml.StartElement("File");
    xml.Attribute("filename", file);
    xml.StartElement("Content");
    xml.Attribute("encoding", "base64");
    xml.Content(this->CTest->Base64EncodeFile(file));
    xml.EndElement(); // Content
    xml.EndElement(); // File
  }
  xml.EndElement(); // Upload
  xml.EndElement(); // Site
  xml.EndDocument();
  return 0;
}